

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O0

void __thiscall QHostAddress::QHostAddress(QHostAddress *this,quint8 *ip6Addr)

{
  QHostAddressPrivate *this_00;
  QHostAddressPrivate *in_stack_ffffffffffffffd8;
  
  this_00 = (QHostAddressPrivate *)operator_new(0x38);
  QHostAddressPrivate::QHostAddressPrivate(this_00);
  QExplicitlySharedDataPointer<QHostAddressPrivate>::QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)this_00,in_stack_ffffffffffffffd8)
  ;
  setAddress((QHostAddress *)this_00,(quint8 *)in_stack_ffffffffffffffd8);
  return;
}

Assistant:

QHostAddress::QHostAddress(const quint8 *ip6Addr)
    : d(new QHostAddressPrivate)
{
    setAddress(ip6Addr);
}